

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QDBusMenuEvent>::clear(QList<QDBusMenuEvent> *this)

{
  long lVar1;
  Data *pDVar2;
  QDBusMenuEvent *pQVar3;
  longlong lVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QDBusMenuEvent> local_38;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->d).size;
  if (lVar1 != 0) {
    pDVar2 = (this->d).d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38.ptr = (QDBusMenuEvent *)&DAT_aaaaaaaaaaaaaaaa;
      if (pDVar2 == (Data *)0x0) {
        lVar4 = 0;
      }
      else {
        lVar4 = (pDVar2->super_QArrayData).alloc;
      }
      local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = (QDBusMenuEvent *)QArrayData::allocate(&local_20,0x48,0x10,lVar4,KeepSize);
      local_38.d = (this->d).d;
      local_38.ptr = (this->d).ptr;
      (this->d).d = (Data *)local_20;
      (this->d).ptr = pQVar3;
      local_38.size = (this->d).size;
      (this->d).size = 0;
      QArrayDataPointer<QDBusMenuEvent>::~QArrayDataPointer(&local_38);
    }
    else {
      pQVar3 = (this->d).ptr;
      std::_Destroy_aux<false>::__destroy<QDBusMenuEvent*>(pQVar3,pQVar3 + lVar1);
      (this->d).size = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }